

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_matrix.c
# Opt level: O0

void rq_matrix_generate(m256v *M,parameters *P,int n_ESIs,uint32_t *ESIs)

{
  uint32_t uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  undefined8 uStackY_c0;
  int aiStackY_b8 [4];
  long local_a8;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  m256v HDPC;
  m256v LDPC;
  m256v LT;
  int i_1;
  int i;
  unsigned_long __vla_expr0;
  int n_ISIs;
  int n_pad;
  int rowoffs;
  int n_cols;
  int n_rows;
  uint32_t *ESIs_local;
  parameters *ppStack_18;
  int n_ESIs_local;
  parameters *P_local;
  m256v *M_local;
  
  uStackY_c0 = 0x10153e;
  _n_cols = ESIs;
  ESIs_local._4_4_ = n_ESIs;
  ppStack_18 = P;
  P_local = (parameters *)M;
  rq_matrix_get_dim(P,n_ESIs,&rowoffs,&n_pad);
  iVar3 = ppStack_18->Kprime - ppStack_18->K;
  uVar4 = ESIs_local._4_4_ + iVar3;
  lVar2 = -((long)(ulong)uVar4 * 4 + 0xfU & 0xfffffffffffffff0);
  lVar5 = (long)aiStackY_b8 + lVar2;
  for (LT.e._4_4_ = 0; LT.e._4_4_ < ESIs_local._4_4_; LT.e._4_4_ = LT.e._4_4_ + 1) {
    uVar1 = _n_cols[LT.e._4_4_];
    aiStackY_b8[2] = iVar3;
    if (_n_cols[LT.e._4_4_] < (uint)ppStack_18->K) {
      aiStackY_b8[2] = 0;
    }
    *(uint32_t *)(lVar5 + (long)LT.e._4_4_ * 4) = uVar1 + aiStackY_b8[2];
    aiStackY_b8[3] = uVar1;
  }
  for (LT.e._0_4_ = 0; (int)LT.e < iVar3; LT.e._0_4_ = (int)LT.e + 1) {
    *(int *)(lVar5 + (long)(ESIs_local._4_4_ + (int)LT.e) * 4) = ppStack_18->K + (int)LT.e;
  }
  local_a8 = lVar5;
  *(undefined8 *)((long)aiStackY_b8 + lVar2 + -8) = 0x10164a;
  m256v_get_subview(*(m256v **)((long)&HDPC + lVar2 + 8),*(int *)((long)&HDPC + lVar2 + 4),
                    *(int *)((long)&HDPC + lVar2),*(int *)(&stack0xffffffffffffff64 + lVar2),
                    *(int *)(&stack0xffffffffffffff60 + lVar2));
  *(undefined8 *)((long)aiStackY_b8 + lVar2 + -8) = 0x101661;
  lt_generate_mat(*(m256v **)((long)&LDPC + lVar2),*(parameters **)((long)&HDPC + lVar2 + 0x10),
                  *(int *)((long)&HDPC + lVar2 + 0xc),*(uint32_t **)((long)&HDPC + lVar2));
  uStackY_c0 = 0x101693;
  m256v_get_subview((m256v *)HDPC.rstride,HDPC.n_col,HDPC.n_row,in_stack_ffffffffffffff64,
                    in_stack_ffffffffffffff60);
  uStackY_c0 = 0x1016a0;
  ldpc_generate_mat((m256v *)HDPC.rstride,(parameters *)CONCAT44(HDPC.n_col,HDPC.n_row));
  uStackY_c0 = 0x1016d2;
  m256v_get_subview((m256v *)HDPC.rstride,HDPC.n_col,HDPC.n_row,in_stack_ffffffffffffff64,
                    in_stack_ffffffffffffff60);
  uStackY_c0 = 0x1016e2;
  hdpc_generate_mat_faster((m256v *)(ulong)uVar4,(parameters *)CONCAT44(LT.e._4_4_,(int)LT.e));
  return;
}

Assistant:

void rq_matrix_generate(m256v* M,
			const parameters* P,
			int n_ESIs,
			const uint32_t* ESIs)
{
	/* Check the matrix dimension */
	int n_rows, n_cols;
	rq_matrix_get_dim(P, n_ESIs, &n_rows, &n_cols);
	assert(n_rows == M->n_row);
	assert(n_cols == M->n_col);

	/* Write LT part of the matrix */
	int rowoffs = 0;
	{
		const int n_pad = P->Kprime - P->K;
		const int n_ISIs = n_ESIs + n_pad;

		/* Convert ESIs to ISIs, append padding symbols */
		uint32_t ISIs[n_ISIs];
		for (int i = 0; i < n_ESIs; ++i)
			ISIs[i] = ESIs[i] + (ESIs[i] >= P->K ? n_pad : 0);
		for (int i = 0; i < n_pad; ++i)
			ISIs[n_ESIs + i] = P->K + i;

		/* Write LT matrix */
		m256v LT = m256v_get_subview(M, 0, 0, n_ISIs, P->L);
		lt_generate_mat(&LT, P, n_ISIs, ISIs);

		rowoffs += n_ISIs;
	}

	/* Write LDPC part of the matrix */
	m256v LDPC = m256v_get_subview(M, rowoffs, 0, P->S, P->L);
	ldpc_generate_mat(&LDPC, P);
	rowoffs += P->S;

	/* Generate HDPC part of the matrix */
	m256v HDPC = m256v_get_subview(M, rowoffs, 0, P->H, P->L);
	hdpc_generate_mat(&HDPC, P);
	rowoffs += P->H;

	assert(rowoffs == n_rows);
}